

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void disruptor::test::BlockingStrategy::WaitForDependents_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  WaitForDependents t;
  char (*in_stack_fffffffffffff3e8) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff3f0;
  std_string *in_stack_fffffffffffff3f8;
  basic_cstring<const_char> *in_stack_fffffffffffff400;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff410;
  basic_wrap_stringstream<char> *pbVar2;
  undefined1 local_b20 [400];
  WaitForDependents *in_stack_fffffffffffff670;
  undefined1 local_988 [16];
  basic_cstring<const_char> local_978;
  undefined1 local_961;
  basic_wrap_stringstream<char> local_960;
  undefined1 local_7c8 [16];
  basic_cstring<const_char> local_7b8;
  undefined1 local_7a1;
  basic_wrap_stringstream<char> local_7a0;
  undefined1 local_608 [16];
  basic_cstring<const_char> local_5f8;
  undefined1 local_5e1;
  basic_wrap_stringstream<char> local_5e0;
  undefined1 local_448 [16];
  basic_cstring<const_char> local_438 [39];
  undefined1 local_1b9;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1b9 = 0x22;
  boost::operator<<(in_stack_fffffffffffff3f0,*in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [18])in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [15])in_stack_fffffffffffff3e8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff410);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_10,0x192,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  WaitForDependents::WaitForDependents((WaitForDependents *)0x122c4f);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_438,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_5e0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::basic_wrap_stringstream<char>::ref(&local_5e0);
  local_5e1 = 0x22;
  boost::operator<<(in_stack_fffffffffffff3f0,*in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [18])in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [16])in_stack_fffffffffffff3e8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff410);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,local_438,0x192,local_448);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::unit_test::setup_conditional<disruptor::test::BlockingStrategy::WaitForDependents>
            ((WaitForDependents *)in_stack_fffffffffffff3f0);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_5f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_7a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::basic_wrap_stringstream<char>::ref(&local_7a0);
  local_7a1 = 0x22;
  boost::operator<<(in_stack_fffffffffffff3f0,*in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [18])in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [13])in_stack_fffffffffffff3e8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff410);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_5f8,0x192,local_608);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  WaitForDependents::test_method(in_stack_fffffffffffff670);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_7b8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_960,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::basic_wrap_stringstream<char>::ref(&local_960);
  local_961 = 0x22;
  boost::operator<<(in_stack_fffffffffffff3f0,*in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [18])in_stack_fffffffffffff3e8);
  boost::operator<<(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff410);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_7b8,0x192,local_7c8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::unit_test::teardown_conditional<disruptor::test::BlockingStrategy::WaitForDependents>
            ((WaitForDependents *)in_stack_fffffffffffff3f0);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_978,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(local_b20,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff3f0);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_b20);
  this = boost::operator<<(in_stack_fffffffffffff3f0,*in_stack_fffffffffffff3e8);
  s = boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [18])in_stack_fffffffffffff3e8);
  this_00 = boost::operator<<(in_stack_fffffffffffff3f0,(char (*) [15])in_stack_fffffffffffff3e8);
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (pbVar2,&local_978,0x192,local_988,in_R8,in_R9,pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  WaitForDependents::~WaitForDependents((WaitForDependents *)0x1230a3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}